

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_8_al_d(void)

{
  byte bVar1;
  uint addr_in;
  uint addr_in_00;
  
  bVar1 = (byte)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in_00 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in_00 = pmmu_translate_addr(addr_in_00);
  }
  addr_in = m68k_read_memory_32(addr_in_00 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,(uint)bVar1);
  m68ki_cpu.n_flag = (uint)bVar1;
  m68ki_cpu.not_z_flag = (uint)bVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_al_d(void)
{
	uint res = MASK_OUT_ABOVE_8(DY);
	uint ea = EA_AL_8();

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}